

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dh_exch.c
# Opt level: O0

int dh_X9_42_kdf_derive(void *vpdhctx,uchar *secret,size_t *secretlen,size_t outlen)

{
  int iVar1;
  void *pvVar2;
  ulong in_RCX;
  size_t *in_RDX;
  long in_RSI;
  size_t *in_RDI;
  int ret;
  size_t stmplen;
  uchar *stmp;
  PROV_DH_CTX *pdhctx;
  uchar *in_stack_00000168;
  char *in_stack_00000170;
  size_t in_stack_00000178;
  uchar *in_stack_00000180;
  size_t in_stack_00000188;
  uchar *in_stack_00000190;
  size_t in_stack_000001a0;
  EVP_MD *in_stack_000001a8;
  OSSL_LIB_CTX *in_stack_000001b0;
  char *in_stack_000001b8;
  undefined8 in_stack_ffffffffffffff88;
  int line;
  char *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  size_t *in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffb0;
  int iVar3;
  void *in_stack_ffffffffffffffb8;
  
  line = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  iVar3 = 0;
  if (in_RSI == 0) {
    *in_RDX = in_RDI[7];
    return 1;
  }
  if (in_RCX < in_RDI[7]) {
    ERR_new();
    ERR_set_debug(in_stack_ffffffffffffffa0,(int)(in_stack_ffffffffffffff98 >> 0x20),
                  in_stack_ffffffffffffff90);
    ERR_set_error(0x39,0x6a,(char *)0x0);
    return 0;
  }
  iVar1 = dh_plain_derive(in_stack_ffffffffffffffb8,(uchar *)(ulong)in_stack_ffffffffffffffb0,
                          in_stack_ffffffffffffffa8,(size_t)in_stack_ffffffffffffffa0);
  if (iVar1 == 0) {
    return 0;
  }
  pvVar2 = CRYPTO_secure_malloc
                     ((size_t)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                      (int)(in_stack_ffffffffffffff98 >> 0x20));
  if (pvVar2 == (void *)0x0) {
    ERR_new();
    ERR_set_debug(in_stack_ffffffffffffffa0,(int)(in_stack_ffffffffffffff98 >> 0x20),
                  in_stack_ffffffffffffff90);
    ERR_set_error(0x39,0xc0100,(char *)0x0);
    return 0;
  }
  iVar1 = dh_plain_derive(in_stack_ffffffffffffffb8,
                          (uchar *)CONCAT44(iVar3,in_stack_ffffffffffffffb0),
                          in_stack_ffffffffffffffa8,(size_t)in_stack_ffffffffffffffa0);
  if (iVar1 != 0) {
    if (*(int *)((long)in_RDI + 0x1c) == 1) {
      line = (int)(in_RDI[6] >> 0x20);
      in_stack_ffffffffffffff90 = (char *)in_RDI[4];
      in_stack_ffffffffffffff98 = *in_RDI;
      in_stack_ffffffffffffffa0 = (char *)0x0;
      iVar1 = ossl_dh_kdf_X9_42_asn1
                        (in_stack_00000190,in_stack_00000188,in_stack_00000180,in_stack_00000178,
                         in_stack_00000170,in_stack_00000168,in_stack_000001a0,in_stack_000001a8,
                         in_stack_000001b0,in_stack_000001b8);
      if (iVar1 == 0) goto LAB_00322e53;
    }
    *in_RDX = in_RDI[7];
    iVar3 = 1;
  }
LAB_00322e53:
  CRYPTO_secure_clear_free
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,line);
  return iVar3;
}

Assistant:

static int dh_X9_42_kdf_derive(void *vpdhctx, unsigned char *secret,
                               size_t *secretlen, size_t outlen)
{
    PROV_DH_CTX *pdhctx = (PROV_DH_CTX *)vpdhctx;
    unsigned char *stmp = NULL;
    size_t stmplen;
    int ret = 0;

    if (secret == NULL) {
        *secretlen = pdhctx->kdf_outlen;
        return 1;
    }

    if (pdhctx->kdf_outlen > outlen) {
        ERR_raise(ERR_LIB_PROV, PROV_R_OUTPUT_BUFFER_TOO_SMALL);
        return 0;
    }
    if (!dh_plain_derive(pdhctx, NULL, &stmplen, 0))
        return 0;
    if ((stmp = OPENSSL_secure_malloc(stmplen)) == NULL) {
        ERR_raise(ERR_LIB_PROV, ERR_R_MALLOC_FAILURE);
        return 0;
    }
    if (!dh_plain_derive(pdhctx, stmp, &stmplen, stmplen))
        goto err;

    /* Do KDF stuff */
    if (pdhctx->kdf_type == PROV_DH_KDF_X9_42_ASN1) {
        if (!ossl_dh_kdf_X9_42_asn1(secret, pdhctx->kdf_outlen,
                                    stmp, stmplen,
                                    pdhctx->kdf_cekalg,
                                    pdhctx->kdf_ukm,
                                    pdhctx->kdf_ukmlen,
                                    pdhctx->kdf_md,
                                    pdhctx->libctx, NULL))
            goto err;
    }
    *secretlen = pdhctx->kdf_outlen;
    ret = 1;
err:
    OPENSSL_secure_clear_free(stmp, stmplen);
    return ret;
}